

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Detonation_PDU::Encode(Detonation_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  Descriptor *pDVar3;
  reference this_00;
  VariableParameter *pVVar4;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
  local_58;
  const_iterator citrEnd;
  const_iterator citr;
  undefined1 local_38 [8];
  MunitionDescriptor md;
  KDataStream *stream_local;
  Detonation_PDU *this_local;
  
  md._24_8_ = stream;
  Warfare_Header::Encode(&this->super_Warfare_Header,stream);
  pKVar2 = DATA_TYPE::operator<<((KDataStream *)md._24_8_,&(this->m_Velocity).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_LocationWorldCoords).super_DataTypeBase);
  pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
  if (pDVar3 == (Descriptor *)0x0) {
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor((MunitionDescriptor *)local_38);
    DATA_TYPE::operator<<((KDataStream *)md._24_8_,(DataTypeBase *)local_38);
    DATA_TYPE::MunitionDescriptor::~MunitionDescriptor((MunitionDescriptor *)local_38);
  }
  else {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator->(&this->m_pDescriptor);
    (*(pDVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pDVar3,md._24_8_);
  }
  pKVar2 = DATA_TYPE::operator<<
                     ((KDataStream *)md._24_8_,&(this->m_LocationEntityCoords).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8DetonationResult);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumOfVariableParams);
  KDataStream::operator<<(pKVar2,this->m_ui16Padding1);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
            ::begin(&this->m_vVariableParameters);
  local_58._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
       ::end(&this->m_vVariableParameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_58);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
              ::operator*(&citrEnd);
    pVVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::operator->(this_00);
    (*(pVVar4->super_DataTypeBase)._vptr_DataTypeBase[5])(pVVar4,md._24_8_);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Detonation_PDU::Encode( KDataStream & stream ) const
{
    Warfare_Header::Encode( stream );

    stream << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_LocationWorldCoords;

    if( !m_pDescriptor.GetPtr() )
    {
        // Create a temp to fill the buffer.
        MunitionDescriptor md;
        stream << KDIS_STREAM md;
    }
    else
    {
        m_pDescriptor->Encode( stream );
    }

    stream << KDIS_STREAM m_LocationEntityCoords
           << m_ui8DetonationResult
           << m_ui8NumOfVariableParams
           << m_ui16Padding1;

    // Add the variable params
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ( *citr )->Encode( stream );
    }
}